

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<ExternTypeInfo,_false,_false>::grow_and_add
          (FastVector<ExternTypeInfo,_false,_false> *this,uint newSize,ExternTypeInfo *val)

{
  uint uVar1;
  ExternTypeInfo *pEVar2;
  long lVar3;
  ExternTypeInfo *pEVar4;
  byte bVar5;
  
  bVar5 = 0;
  pEVar2 = this->data;
  grow_no_destroy(this,newSize);
  uVar1 = this->count;
  this->count = uVar1 + 1;
  pEVar4 = this->data + uVar1;
  for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
    pEVar4->offsetToName = val->offsetToName;
    val = (ExternTypeInfo *)((long)val + (ulong)bVar5 * -8 + 4);
    pEVar4 = (ExternTypeInfo *)((long)pEVar4 + ((ulong)bVar5 * -2 + 1) * 4);
  }
  if (pEVar2 != (ExternTypeInfo *)0x0) {
    (*(code *)NULLC::dealloc)(pEVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}